

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_append_text_runes(nk_str *str,nk_rune *text,int len)

{
  int len_00;
  int iVar1;
  ulong uVar2;
  nk_glyph glyph;
  char local_34 [4];
  
  iVar1 = 0;
  if ((len != 0 && (text != (nk_rune *)0x0 && str != (nk_str *)0x0)) && (iVar1 = len, 0 < len)) {
    uVar2 = 0;
    do {
      len_00 = nk_utf_encode(text[uVar2],local_34,4);
      if (len_00 == 0) {
        return len;
      }
      nk_str_append_text_char(str,local_34,len_00);
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  return iVar1;
}

Assistant:

NK_API int
nk_str_append_text_runes(struct nk_str *str, const nk_rune *text, int len)
{
int i = 0;
int byte_len = 0;
nk_glyph glyph;

NK_ASSERT(str);
if (!str || !text || !len) return 0;
for (i = 0; i < len; ++i) {
byte_len = nk_utf_encode(text[i], glyph, NK_UTF_SIZE);
if (!byte_len) break;
nk_str_append_text_char(str, glyph, byte_len);
}
return len;
}